

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O1

void uint256_tests::TestFromHex<uint160>(void)

{
  char __c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  undefined1 auVar3 [8];
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  undefined1 **ppuVar7;
  char *pcVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long lVar11;
  long in_FS_OFFSET;
  readonly_property<bool> rVar12;
  bool bVar13;
  const_string file;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view str_00;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string chars_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  string invalid_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  optional<uint160> valid_result;
  check_type cVar14;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  optional<uint160> local_148;
  string local_130;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  undefined1 local_70 [8];
  bool local_68;
  undefined7 uStack_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF",
             "");
  pcVar6 = &DAT_00000028;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_d0,&local_b0,0,0x28);
  str_01._M_str = pcVar6;
  str_01._M_len = (size_t)local_d0._M_dataplus._M_p;
  detail::FromHex<uint160>((optional<uint160> *)local_50,(detail *)local_d0._M_string_length,str_01)
  ;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x165;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_90[0] = local_50[0x14];
  local_90._8_8_ = (element_type *)0x0;
  aStack_80._M_allocated_capacity = 0;
  local_60._8_8_ = local_f0;
  local_f0._0_8_ = "valid_result";
  local_f0._8_8_ = (long)"valid_result" + 0xc;
  local_68 = false;
  local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1b0 = "";
  pvVar9 = (iterator)0x2;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_90,(lazy_ostream *)local_70,2,0,WARN,_cVar14,
             (size_t)&local_1b8,0x165);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_80._M_allocated_capacity);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x166;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_110,local_50);
  str._M_str = local_d0._M_dataplus._M_p;
  str._M_len = local_d0._M_string_length;
  ToLower_abi_cxx11_(&local_130,str);
  if (local_110._8_8_ == local_130._M_string_length) {
    if (local_110._8_8_ == 0) {
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar4 = bcmp((void *)local_110._0_8_,local_130._M_dataplus._M_p,local_110._8_8_);
      rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
    }
  }
  else {
    rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_168[0] = rVar12.super_class_property<bool>.value;
  local_168._8_8_ = (element_type *)0x0;
  aStack_158._M_allocated_capacity = 0;
  local_148.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_148.super__Optional_base<uint160,_true,_true>._M_payload.
  super__Optional_payload_base<uint160>._M_payload._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
       + 0x5f;
  local_60._8_8_ = &local_178;
  local_68 = false;
  local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_80._8_8_ = local_188 + 8;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = &PTR__lazy_ostream_013d3d70;
  aStack_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar6 = "valid_result->ToString()";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_188._8_8_ = &local_130;
  local_178._M_allocated_capacity = (size_type)(string *)local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)local_f0,1,2,REQUIRE,0xf97b98,
             (size_t)&local_148,0x166,(lazy_ostream *)local_70,"ToLower(valid_input)",
             (assertion_result *)local_90);
  boost::detail::shared_count::~shared_count((shared_count *)(local_168 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &aStack_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1e0 = "";
  ppuVar7 = &local_1f8;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x16a;
  file_01.m_begin = (iterator)&local_1e8;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar7,msg_01);
  str_02._M_str = (char *)ppuVar7;
  str_02._M_len = (size_t)"";
  detail::FromHex<uint160>((optional<uint160> *)local_f0,(detail *)0x0,str_02);
  local_90._0_8_ = CONCAT71(local_90._1_7_,aStack_e0._M_local_buf[4]) ^ 1;
  local_90._8_8_ = (element_type *)0x0;
  aStack_80._M_allocated_capacity = 0;
  local_110._0_8_ = "!T::FromHex(\"\")";
  local_110._8_8_ = (long)"!T::FromHex(\"\")" + 0xf;
  local_68 = false;
  local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_200 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._8_8_ = (string *)local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_90,(lazy_ostream *)local_70,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_208,0x16a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_80._M_allocated_capacity);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_210 = "";
  ppuVar7 = &local_228;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x16b;
  file_02.m_begin = (iterator)&local_218;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar7,msg_02);
  str_03._M_str = (char *)ppuVar7;
  str_03._M_len = (size_t)"0";
  detail::FromHex<uint160>((optional<uint160> *)local_f0,(detail *)0x1,str_03);
  local_90._0_8_ = CONCAT71(local_90._1_7_,aStack_e0._M_local_buf[4]) ^ 1;
  local_90._8_8_ = (element_type *)0x0;
  aStack_80._M_allocated_capacity = 0;
  local_110._0_8_ = "!T::FromHex(\"0\")";
  local_110._8_8_ = (long)"!T::FromHex(\"0\")" + 0x10;
  local_68 = false;
  local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_230 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._8_8_ = (string *)local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_90,(lazy_ostream *)local_70,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_238,0x16b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_80._M_allocated_capacity);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x16c;
  file_03.m_begin = (iterator)&local_248;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_258,
             msg_03);
  pcVar8 = (char *)0x14;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,&local_d0
             ,0,0x14);
  str_04._M_str = pcVar8;
  str_04._M_len = (size_t)local_70;
  detail::FromHex<uint160>
            ((optional<uint160> *)local_110,(detail *)CONCAT71(uStack_67,local_68),str_04);
  local_f0._0_8_ = CONCAT71(local_f0._1_7_,aStack_100._M_local_buf[4]) ^ 1;
  local_f0._8_8_ = 0;
  aStack_e0._M_allocated_capacity = 0;
  local_130._M_dataplus._M_p = "!T::FromHex(valid_input.substr(0, num_chars / 2))";
  local_130._M_string_length = 0xf97c18;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_260 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_80._8_8_ = &local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)local_90,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_268,0x16c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,(ulong)(local_60._M_allocated_capacity + 1));
  }
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x16d;
  file_04.m_begin = (iterator)&local_278;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_288,
             msg_04);
  pcVar8 = (char *)0x27;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,&local_d0
             ,0,0x27);
  str_05._M_str = pcVar8;
  str_05._M_len = (size_t)local_70;
  detail::FromHex<uint160>
            ((optional<uint160> *)local_110,(detail *)CONCAT71(uStack_67,local_68),str_05);
  local_f0._0_8_ = CONCAT71(local_f0._1_7_,aStack_100._M_local_buf[4]) ^ 1;
  local_f0._8_8_ = 0;
  aStack_e0._M_allocated_capacity = 0;
  local_130._M_dataplus._M_p = "!T::FromHex(valid_input.substr(0, num_chars - 1))";
  local_130._M_string_length = 0xf97c4a;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_290 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_80._8_8_ = &local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)local_90,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_298,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,(ulong)(local_60._M_allocated_capacity + 1));
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2a0 = "";
  ppuVar7 = &local_2b8;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x16e;
  file_05.m_begin = (iterator)&local_2a8;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar7,msg_05);
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_d0._M_dataplus._M_p,
             (detail *)(local_d0._M_string_length + (long)local_d0._M_dataplus._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"0");
  str_06._M_str = (char *)ppuVar7;
  str_06._M_len = (size_t)local_70;
  detail::FromHex<uint160>
            ((optional<uint160> *)local_110,(detail *)CONCAT71(uStack_67,local_68),str_06);
  local_f0._0_8_ = CONCAT71(local_f0._1_7_,aStack_100._M_local_buf[4]) ^ 1;
  local_f0._8_8_ = 0;
  aStack_e0._M_allocated_capacity = 0;
  local_130._M_dataplus._M_p = "!T::FromHex(valid_input + \"0\")";
  local_130._M_string_length = 0xf97c69;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2c0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_80._8_8_ = &local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)local_90,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_2c8,0x16e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,(ulong)(local_60._M_allocated_capacity + 1));
  }
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             " !\"#$%&\'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\\]^_`ghijklmnopqrstuvwxyz{|}~","");
  auVar3 = local_70;
  lVar2 = CONCAT71(uStack_67,local_68);
  if (lVar2 != 0) {
    lVar11 = 0;
    do {
      __c = *(char *)((long)auVar3 + lVar11);
      local_2d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_2d0 = "";
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x174;
      file_06.m_begin = (iterator)&local_2d8;
      msg_06.m_end = pvVar10;
      msg_06.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2e8,
                 msg_06);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 &local_d0,0,0x27);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f0,local_f0._8_8_,0,1,__c);
      local_90._0_8_ = &aStack_80;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      str_07._M_str = &pbVar5->field_2;
      if (paVar1 == str_07._M_str) {
        aStack_80._M_allocated_capacity = (str_07._M_str)->_M_allocated_capacity;
        aStack_80._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      }
      else {
        aStack_80._M_allocated_capacity = (str_07._M_str)->_M_allocated_capacity;
        local_90._0_8_ = paVar1;
      }
      local_90._8_8_ = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)str_07._M_str;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      str_07._M_len = local_90._0_8_;
      detail::FromHex<uint160>((optional<uint160> *)local_168,(detail *)local_90._8_8_,str_07);
      local_130._M_dataplus._M_p =
           (pointer)(CONCAT71(local_130._M_dataplus._M_p._1_7_,aStack_158._M_local_buf[4]) ^ 1);
      local_130._M_string_length = 0;
      local_130.field_2._M_allocated_capacity = 0;
      local_50._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars - 1) + c)";
      local_50._8_8_ = (long)"!T::FromHex(valid_input.substr(0, num_chars - 1) + c)" + 0x35;
      local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
      local_110._0_8_ = &PTR__lazy_ostream_013d3df0;
      aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_100._8_8_ = local_50;
      local_2f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_2f0 = "";
      pvVar9 = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_130,(lazy_ostream *)local_110,1,0,WARN,
                 (check_type)pcVar6,(size_t)&local_2f8,0x174);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_130.field_2._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._0_8_ != &aStack_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(aStack_80._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ != &aStack_e0) {
        operator_delete((void *)local_f0._0_8_,(ulong)(aStack_e0._M_allocated_capacity + 1));
      }
      lVar11 = lVar11 + 1;
    } while (lVar2 != lVar11);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,"0x",
                 &local_d0);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_300 = "";
  ppuVar7 = &local_318;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x178;
  file_07.m_begin = (iterator)&local_308;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar7,msg_07);
  str_08._M_str = (char *)ppuVar7;
  str_08._M_len = local_90._0_8_;
  detail::FromHex<uint160>((optional<uint160> *)&local_130,(detail *)&DAT_00000028,str_08);
  local_110._0_8_ = CONCAT71(local_110._1_7_,local_130.field_2._M_local_buf[4]) ^ 1;
  local_110._8_8_ = 0;
  aStack_100._M_allocated_capacity = 0;
  local_168._0_8_ = "!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))";
  local_168._8_8_ = (long)"!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))" + 0x3f;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_320 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_e0._8_8_ = local_168;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_328,0x178);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100._M_allocated_capacity);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_330 = "";
  ppuVar7 = &local_348;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x179;
  file_08.m_begin = (iterator)&local_338;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar7,msg_08);
  str_09._M_str = (char *)ppuVar7;
  str_09._M_len = local_90._0_8_;
  detail::FromHex<uint160>((optional<uint160> *)&local_130,(detail *)local_90._8_8_,str_09);
  local_110._0_8_ = CONCAT71(local_110._1_7_,local_130.field_2._M_local_buf[4]) ^ 1;
  local_110._8_8_ = 0;
  aStack_100._M_allocated_capacity = 0;
  local_168._0_8_ = "!T::FromHex(invalid_prefix)";
  local_168._8_8_ = (long)"!T::FromHex(invalid_prefix)" + 0x1b;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_013d3df0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_350 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  aStack_e0._8_8_ = local_168;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_110,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_358,0x179);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._0_8_ != &aStack_80) {
    operator_delete((void *)local_90._0_8_,(ulong)(aStack_80._M_allocated_capacity + 1));
  }
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,(ulong)(local_60._M_allocated_capacity + 1));
  }
  local_f0._0_8_ = &aStack_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,"0123");
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_360 = "";
  ppuVar7 = &local_378;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x17e;
  file_09.m_begin = (iterator)&local_368;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar7,msg_09);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str_10._M_str = (char *)ppuVar7;
  str_10._M_len = local_f0._0_8_;
  detail::FromHex<uint160>(&local_148,(detail *)&DAT_00000028,str_10);
  if (local_148.super__Optional_base<uint160,_true,_true>._M_payload.
      super__Optional_payload_base<uint160>._M_engaged == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<160u>::ToString_abi_cxx11_(&local_130,&local_148);
    str_00._M_str = local_d0._M_dataplus._M_p;
    str_00._M_len = local_d0._M_string_length;
    ToLower_abi_cxx11_((string *)local_168,str_00);
    if (local_130._M_string_length == local_168._8_8_) {
      if ((element_type *)local_130._M_string_length == (element_type *)0x0) {
        bVar13 = true;
      }
      else {
        iVar4 = bcmp(local_130._M_dataplus._M_p,(void *)local_168._0_8_,local_130._M_string_length);
        bVar13 = iVar4 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    local_50[0] = bVar13;
    local_50._8_8_ = (char *)0x0;
    local_50._16_8_ = (sp_counted_base *)0x0;
    local_178._M_allocated_capacity = 0xf96670;
    local_178._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
         + 0x5f;
    local_68 = false;
    local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
    local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_60._8_8_ = local_188 + 8;
    aStack_80._8_8_ = local_188;
    local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
    local_90._0_8_ = &PTR__lazy_ostream_013d3d70;
    aStack_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pcVar6 = "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_188._0_8_ = (string *)local_168;
    local_188._8_8_ = &local_130;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_50,(lazy_ostream *)local_110,1,2,REQUIRE,0xf97d4b,
               (size_t)&local_178,0x17e,local_70,"ToLower(valid_input)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    boost::detail::shared_count::~shared_count((shared_count *)(local_50 + 0x10));
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,(ulong)(aStack_158._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_388 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_380 = "";
    ppuVar7 = &local_398;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x17f;
    file_10.m_begin = (iterator)&local_388;
    msg_10.m_end = pvVar10;
    msg_10.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar7,msg_10
              );
    str_11._M_str = (char *)ppuVar7;
    str_11._M_len = local_f0._0_8_;
    detail::FromHex<uint160>((optional<uint160> *)local_110,(detail *)0x27,str_11);
    local_90._0_8_ = CONCAT71(local_90._1_7_,aStack_100._M_local_buf[4]) ^ 1;
    local_90._8_8_ = (element_type *)0x0;
    aStack_80._M_allocated_capacity = 0;
    local_130._M_dataplus._M_p = "!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))";
    local_130._M_string_length = 0xf97dd4;
    local_68 = false;
    local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3a0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_60._8_8_ = &local_130;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_90,(lazy_ostream *)local_70,1,0,WARN,(check_type)pcVar6,
               (size_t)&local_3a8,0x17f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_80._M_allocated_capacity);
    local_3b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3b0 = "";
    ppuVar7 = &local_3c8;
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x180;
    file_11.m_begin = (iterator)&local_3b8;
    msg_11.m_end = pvVar10;
    msg_11.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)ppuVar7,msg_11
              );
    str_12._M_str = (char *)ppuVar7;
    str_12._M_len = local_f0._0_8_;
    detail::FromHex<uint160>((optional<uint160> *)local_110,(detail *)0x29,str_12);
    local_90._0_8_ = CONCAT71(local_90._1_7_,aStack_100._M_local_buf[4]) ^ 1;
    local_90._8_8_ = (element_type *)0x0;
    aStack_80._M_allocated_capacity = 0;
    local_130._M_dataplus._M_p = "!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))";
    local_130._M_string_length = 0xf97e12;
    local_68 = false;
    local_70 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    local_60._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3d0 = "";
    local_60._8_8_ = &local_130;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_90,(lazy_ostream *)local_70,1,0,WARN,(check_type)pcVar6,
               (size_t)&local_3d8,0x180);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_80._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ != &aStack_e0) {
      operator_delete((void *)local_f0._0_8_,(ulong)(aStack_e0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}